

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if ((cond == 0) || (((char)*(uint *)&window->field_0xb4 & cond) != 0)) {
    *(uint *)&window->field_0xb4 = *(uint *)&window->field_0xb4 & 0xfffffff1;
    (window->SetWindowPosVal).x = 3.4028235e+38;
    (window->SetWindowPosVal).y = 3.4028235e+38;
    auVar11._8_8_ = 0;
    auVar11._0_4_ = (window->Pos).x;
    auVar11._4_4_ = (window->Pos).y;
    IVar1 = (window->DC).CursorPos;
    IVar2 = (window->DC).IdealMaxPos;
    auVar8._0_4_ = (int)(*pos).x;
    auVar8._4_4_ = (int)(*pos).y;
    auVar8._8_8_ = 0;
    auVar8 = vcvtdq2ps_avx(auVar8);
    IVar3 = (ImVec2)vmovlps_avx(auVar8);
    window->Pos = IVar3;
    auVar8 = vsubps_avx(auVar8,auVar11);
    fVar7 = auVar8._0_4_;
    auVar12._0_4_ = fVar7 + IVar1.x;
    fVar10 = auVar8._4_4_;
    auVar12._4_4_ = fVar10 + IVar1.y;
    auVar12._8_4_ = auVar8._8_4_ + 0.0;
    auVar12._12_4_ = auVar8._12_4_ + 0.0;
    auVar9._0_4_ = fVar7 + IVar2.x;
    auVar9._4_4_ = fVar10 + IVar2.y;
    auVar9._8_4_ = auVar8._8_4_ + 0.0;
    auVar9._12_4_ = auVar8._12_4_ + 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar12);
    (window->DC).CursorPos = IVar1;
    IVar1 = (ImVec2)vmovlps_avx(auVar9);
    (window->DC).IdealMaxPos = IVar1;
    fVar4 = (window->DC).CursorStartPos.y;
    fVar5 = (window->DC).CursorMaxPos.x;
    fVar6 = (window->DC).CursorMaxPos.y;
    (window->DC).CursorStartPos.x = fVar7 + (window->DC).CursorStartPos.x;
    (window->DC).CursorStartPos.y = fVar10 + fVar4;
    (window->DC).CursorMaxPos.x = fVar7 + fVar5;
    (window->DC).CursorMaxPos.y = fVar10 + fVar6;
  }
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.IdealMaxPos += offset;
    window->DC.CursorStartPos += offset;
}